

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseOperatorName(State *state)

{
  char cVar1;
  byte bVar2;
  undefined1 uVar3;
  short sVar4;
  undefined1 uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined **ppuVar12;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  
  bVar11 = AtLeastNumCharsRemaining(state->mangled_cur,2);
  if (bVar11) {
    pcVar6 = state->mangled_cur;
    pcVar7 = state->out_cur;
    pcVar8 = state->out_begin;
    pcVar9 = state->out_end;
    uVar10 = *(undefined8 *)((long)&state->prev_name + 4);
    uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
    local_4c = (undefined4)((ulong)pcVar7 >> 0x20);
    uStack_48 = SUB84(pcVar8,0);
    uStack_44 = (undefined4)((ulong)pcVar8 >> 0x20);
    uStack_40 = SUB84(pcVar9,0);
    uStack_3c = (undefined4)((ulong)pcVar9 >> 0x20);
    sVar4 = state->nest_level;
    uVar3 = state->append;
    uVar5 = state->overflowed;
    bVar11 = ParseTwoCharToken(state,"cv");
    if (bVar11) {
      MaybeAppend(state,"operator ");
      state->nest_level = 0;
      bVar11 = ParseType(state);
      if (bVar11) {
        state->nest_level = sVar4;
        return true;
      }
    }
    state->mangled_cur = pcVar6;
    state->out_cur = pcVar7;
    state->out_begin = pcVar8;
    state->out_end = pcVar9;
    *(ulong *)((long)&state->out_cur + 4) = CONCAT44(uStack_48,local_4c);
    *(ulong *)((long)&state->out_begin + 4) = CONCAT44(uStack_40,uStack_44);
    *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,uStack_3c);
    *(undefined8 *)((long)&state->prev_name + 4) = uVar10;
    state->nest_level = sVar4;
    state->append = (bool)uVar3;
    state->overflowed = (bool)uVar5;
    if (*state->mangled_cur == 'v') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar11 = ParseCharClass(state,"0123456789");
      if ((bVar11) && (bVar11 = ParseSourceName(state), bVar11)) {
        return true;
      }
    }
    state->mangled_cur = pcVar6;
    state->out_cur = pcVar7;
    state->out_begin = pcVar8;
    state->out_end = pcVar9;
    *(ulong *)((long)&state->out_cur + 4) = CONCAT44(uStack_48,local_4c);
    *(ulong *)((long)&state->out_begin + 4) = CONCAT44(uStack_40,uStack_44);
    *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,uStack_3c);
    *(undefined8 *)((long)&state->prev_name + 4) = uVar10;
    state->nest_level = sVar4;
    state->append = (bool)uVar3;
    state->overflowed = (bool)uVar5;
    cVar1 = *state->mangled_cur;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) &&
       (bVar2 = state->mangled_cur[1], (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
      for (ppuVar12 = &PTR_anon_var_dwarf_6768b_0014da38; pcVar6 = ppuVar12[-1],
          pcVar6 != (char *)0x0; ppuVar12 = ppuVar12 + 2) {
        if ((cVar1 == *pcVar6) && (bVar2 == pcVar6[1])) {
          MaybeAppend(state,"operator");
          pcVar6 = *ppuVar12;
          if ((byte)(*pcVar6 + 0x9fU) < 0x1a) {
            MaybeAppend(state," ");
          }
          MaybeAppend(state,pcVar6);
          state->mangled_cur = state->mangled_cur + 2;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ParseOperatorName(State *state) {
  if (!AtLeastNumCharsRemaining(state->mangled_cur, 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  State copy = *state;
  if (ParseTwoCharToken(state, "cv") &&
      MaybeAppend(state, "operator ") &&
      EnterNestedName(state) &&
      ParseType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    return true;
  }
  *state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseCharClass(state, "0123456789") &&
      ParseSourceName(state)) {
    return true;
  }
  *state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(state->mangled_cur[0]) &&
        IsAlpha(state->mangled_cur[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != NULL; ++p) {
    if (state->mangled_cur[0] == p->abbrev[0] &&
        state->mangled_cur[1] == p->abbrev[1]) {
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->mangled_cur += 2;
      return true;
    }
  }
  return false;
}